

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O0

bool AllIdentical<aiQuatKey>(aiQuatKey *in,uint num,ai_real epsilon)

{
  bool bVar1;
  uint local_28;
  uint local_24;
  uint i_1;
  uint i;
  ai_real epsilon_local;
  uint num_local;
  aiQuatKey *in_local;
  
  if (1 < num) {
    if (ABS(epsilon) <= 0.0) {
      for (local_28 = 0; local_28 < num - 1; local_28 = local_28 + 1) {
        bVar1 = aiQuatKey::operator!=(in + local_28,in + (local_28 + 1));
        if (bVar1) {
          return false;
        }
      }
    }
    else {
      for (local_24 = 0; local_24 < num - 1; local_24 = local_24 + 1) {
        bVar1 = EpsilonCompare<aiQuatKey>(in + local_24,in + (local_24 + 1),epsilon);
        if (!bVar1) {
          return false;
        }
      }
    }
  }
  return true;
}

Assistant:

inline
bool AllIdentical(T* in, unsigned int num, ai_real epsilon) {
    if (num <= 1) {
        return true;
    }

    if (fabs(epsilon) > 0.f) {
        for (unsigned int i = 0; i < num-1;++i) {
            if (!EpsilonCompare(in[i],in[i+1],epsilon)) {
                return false;
            }
        }
    } else {
        for (unsigned int i = 0; i < num-1;++i) {
            if (in[i] != in[i+1]) {
                return false;
            }
        }
    }
    return true;
}